

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O0

PropertyRecord * Js::InternalPropertyRecords::GetInternalPropertyName(PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  PropertyRecord *pPStack_10;
  PropertyId propertyId_local;
  
  BVar3 = IsInternalPropertyId(propertyId);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                                ,0x6d,"(IsInternalPropertyId(propertyId))",
                                "IsInternalPropertyId(propertyId)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  switch(propertyId) {
  case 0:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)TypeOfPrototypeObjectInlined);
    break;
  case 1:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)TypeOfPrototypeObjectDictionary);
    break;
  case 2:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)NonExtensibleType);
    break;
  case 3:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)SealedType);
    break;
  case 4:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)FrozenType);
    break;
  case 5:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)StackTrace);
    break;
  case 6:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)StackTraceCache);
    break;
  case 7:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)WeakMapKeyMap);
    break;
  case 8:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)HiddenObject);
    break;
  case 9:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)CachedUCollator);
    break;
  case 10:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)CachedUNumberFormat);
    break;
  case 0xb:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)CachedUDateFormat);
    break;
  case 0xc:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)CachedUPluralRules);
    break;
  case 0xd:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)RevocableProxy);
    break;
  case 0xe:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)MutationBp);
    break;
  case 0xf:
    pPStack_10 = BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                           ((BuiltInPropertyRecord *)EmbedderData);
    break;
  default:
    Throw::FatalInternalError(-0x7fffbffb);
  }
  return pPStack_10;
}

Assistant:

const PropertyRecord* InternalPropertyRecords::GetInternalPropertyName(PropertyId propertyId)
    {
        Assert(IsInternalPropertyId(propertyId));

        switch (propertyId)
        {
#define INTERNALPROPERTY(name) \
            case InternalPropertyIds::name: \
                return InternalPropertyRecords::name;
#include "InternalPropertyList.h"
        }

        Throw::FatalInternalError();
    }